

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

S1Interval __thiscall S1Interval::Complement(S1Interval *this)

{
  double dVar1;
  double dVar2;
  S1Interval SVar3;
  S2LogMessage SStack_18;
  
  dVar2 = (this->bounds_).c_[0];
  dVar1 = (this->bounds_).c_[1];
  if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
    if (((3.141592653589793 < ABS(dVar2)) || (3.141592653589793 < ABS(dVar1))) ||
       (((((dVar2 != 3.141592653589793 || (NAN(dVar2))) && (dVar1 == -3.141592653589793)) &&
         (!NAN(dVar1))) ||
        (((dVar2 == -3.141592653589793 && (!NAN(dVar2))) &&
         ((dVar1 != 3.141592653589793 || (NAN(dVar1))))))))) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0xe4,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: is_valid() ",0x19);
      abort();
    }
  }
  else {
    dVar1 = -3.141592653589793;
    dVar2 = 3.141592653589793;
  }
  SVar3.bounds_.c_[1] = dVar2;
  SVar3.bounds_.c_[0] = dVar1;
  return (S1Interval)SVar3.bounds_.c_;
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}